

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&>
          (detail *this,basic_string_view<char> format_str,
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          *handler)

{
  ulong uVar1;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *pfVar2;
  size_t sVar3;
  bool bVar4;
  detail dVar5;
  id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&,_char>
  in_RAX;
  detail *pdVar6;
  void *pvVar7;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *this_00;
  char *unaff_RBX;
  detail *this_01;
  detail *pdVar8;
  detail *pdVar9;
  buffer<char> *c;
  detail *end;
  
  this_00 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             *)format_str.size_;
  end = (detail *)(format_str.data_ + (long)this);
  pdVar9 = this;
  do {
    if (pdVar9 == end) {
      return;
    }
    pdVar6 = pdVar9;
    if (*pdVar9 == (detail)0x7b) {
LAB_00107d87:
      if (pdVar9 != pdVar6) {
        do {
          if ((long)pdVar6 - (long)pdVar9 < 0) goto LAB_00107f2f;
          this_01 = pdVar9;
          pvVar7 = memchr(pdVar9,0x7d,(long)pdVar6 - (long)pdVar9);
          if (pvVar7 == (void *)0x0) {
            this = (detail *)this_00;
            format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
            ::on_text(this_00,(char *)pdVar9,(char *)pdVar6);
          }
          else {
            pdVar8 = (detail *)((long)pvVar7 + 1);
            if ((pdVar8 == pdVar6) || (*pdVar8 != (detail)0x7d)) goto LAB_00107f23;
            this = (detail *)this_00;
            format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
            ::on_text(this_00,(char *)pdVar9,(char *)pdVar8);
            pdVar9 = (detail *)((long)pvVar7 + 2);
          }
        } while (pvVar7 != (void *)0x0);
      }
      pdVar6 = pdVar6 + 1;
      if (pdVar6 == end) {
        error_handler::on_error((error_handler *)this,"invalid format string");
      }
      if (*pdVar6 == (detail)0x7b) {
        pfVar2 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                  *)(this_00->context).out_.container;
        sVar3 = (pfVar2->parse_context).format_str_.size_;
        uVar1 = sVar3 + 1;
        if (*(ulong *)&(pfVar2->parse_context).next_arg_id_ < uVar1) {
          this = (detail *)pfVar2;
          (*(code *)**(undefined8 **)&pfVar2->field_0x0)(pfVar2,uVar1);
        }
        (pfVar2->parse_context).format_str_.size_ = uVar1;
        *(detail *)((pfVar2->parse_context).format_str_.data_ + sVar3) = *pdVar6;
        (this_00->context).out_.container = (buffer<char> *)pfVar2;
      }
      else {
        if (*pdVar6 == (detail)0x7d) {
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          ::on_arg_id(this_00);
          pdVar9 = pdVar6;
        }
        else {
          in_RAX.handler = this_00;
          pdVar9 = (detail *)
                   parse_arg_id<char,fmt::v6::detail::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&,char>>
                             ((char *)pdVar6,(char *)end,
                              (id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&,_char>
                               *)&stack0xffffffffffffffc8);
          if (pdVar9 == end) {
            dVar5 = (detail)0x0;
          }
          else {
            dVar5 = *pdVar9;
          }
          if (dVar5 == (detail)0x3a) {
            this = (detail *)this_00;
            pdVar6 = (detail *)
                     format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                     ::on_format_specs(this_00,(char *)(pdVar9 + 1),(char *)end);
            if ((pdVar6 == end) || (*pdVar6 != (detail)0x7d)) {
              error_handler::on_error((error_handler *)this,"unknown format specifier");
            }
            goto LAB_00107f04;
          }
          if (dVar5 != (detail)0x7d) {
            error_handler::on_error((error_handler *)pdVar6,"missing \'}\' in format string");
          }
        }
        pdVar6 = pdVar9;
        this = (detail *)this_00;
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
        ::on_replacement_field(this_00,(char *)pdVar6);
      }
LAB_00107f04:
      pdVar9 = pdVar6 + 1;
      bVar4 = true;
    }
    else {
      this = pdVar9 + 1;
      if ((long)end - (long)this < 0) {
LAB_00107f2f:
        assert_fail(unaff_RBX,0,(char *)in_RAX.handler);
      }
      pdVar6 = (detail *)memchr(this,0x7b,(long)end - (long)this);
      pdVar8 = pdVar9;
      if (pdVar6 != (detail *)0x0) goto LAB_00107d87;
      do {
        if ((long)end - (long)pdVar8 < 0) goto LAB_00107f2f;
        this_01 = pdVar8;
        pvVar7 = memchr(pdVar8,0x7d,(long)end - (long)pdVar8);
        if (pvVar7 == (void *)0x0) {
          this = (detail *)this_00;
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          ::on_text(this_00,(char *)pdVar8,(char *)end);
        }
        else {
          pdVar6 = (detail *)((long)pvVar7 + 1);
          if ((pdVar6 == end) || (*pdVar6 != (detail)0x7d)) {
LAB_00107f23:
            error_handler::on_error((error_handler *)this_01,"unmatched \'}\' in format string");
          }
          this = (detail *)this_00;
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          ::on_text(this_00,(char *)pdVar8,(char *)pdVar6);
          pdVar8 = (detail *)((long)pvVar7 + 2);
        }
      } while (pvVar7 != (void *)0x0);
      bVar4 = false;
    }
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin + 1, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}